

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_quicblock(void)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  long local_c8;
  size_t i;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint8_t *puStack_38;
  int ret;
  uint8_t *end;
  uint8_t *src;
  ptls_buffer_t buf;
  
  ptls_buffer_init((ptls_buffer_t *)&src,"",0);
  body_start = 0xffffffffffffffff;
  capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,"",1);
  if (capacity._4_4_ == 0) {
    body_size = buf.capacity;
    capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,"abc",3);
    if (capacity._4_4_ == 0) {
      _capacity = buf.capacity - body_size;
      if (body_start == 0xffffffffffffffff) {
        capacity._4_4_ = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)&src,_capacity);
        if (capacity._4_4_ != 0) goto LAB_0013e130;
      }
      else {
        for (; body_start != 0; body_start = body_start - 1) {
          src[body_size - body_start] =
               (uint8_t)(_capacity >> (((char)body_start + -1) * '\b' & 0x3fU));
        }
      }
      capacity._4_4_ = 0;
      end = src;
      puStack_38 = src + buf.capacity;
      _block_size = 0xffffffffffffffff;
      end_1 = src;
      _src = (uint8_t *)ptls_decode_quicint(&end_1,puStack_38);
      if (_src == (uint8_t *)0xffffffffffffffff) {
        capacity._4_4_ = 0x32;
      }
      else {
        end = end_1;
        _block_size64 = (uint64_t)_src;
        if (puStack_38 + -(long)end_1 < _src) {
          capacity._4_4_ = 0x32;
        }
        else {
          capacity_1 = (size_t)(end_1 + (long)_src);
          _ok((uint)(capacity_1 - (long)end_1 == 3),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5ea);
          iVar2 = memcmp(end,"abc",3);
          _ok((uint)(iVar2 == 0),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5eb);
          end = end + 3;
          if (end == (uint8_t *)capacity_1) {
            if (end == puStack_38) {
              buf.capacity = 0;
              body_start_1 = 0xffffffffffffffff;
              capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,"",1);
              if (capacity._4_4_ == 0) {
                body_size_1 = buf.capacity;
                capacity._4_4_ = ptls_buffer_reserve((ptls_buffer_t *)&src,0x7b);
                if (capacity._4_4_ == 0) {
                  memset(src + buf.capacity,0x55,0x7b);
                  buf.capacity = buf.capacity + 0x7b;
                  _capacity_1 = buf.capacity - body_size_1;
                  if (body_start_1 == 0xffffffffffffffff) {
                    capacity._4_4_ =
                         ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)&src,_capacity_1);
                    if (capacity._4_4_ != 0) goto LAB_0013e130;
                  }
                  else {
                    for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                      src[body_size_1 - body_start_1] =
                           (uint8_t)(_capacity_1 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                    }
                  }
                  end = src;
                  puStack_38 = src + buf.capacity;
                  _block_size_1 = 0xffffffffffffffff;
                  end_2 = src;
                  _src_1 = (uint8_t *)ptls_decode_quicint(&end_2,puStack_38);
                  if (_src_1 == (uint8_t *)0xffffffffffffffff) {
                    capacity._4_4_ = 0x32;
                  }
                  else {
                    end = end_2;
                    _block_size64_1 = (uint64_t)_src_1;
                    if (puStack_38 + -(long)end_2 < _src_1) {
                      capacity._4_4_ = 0x32;
                    }
                    else {
                      puVar3 = end_2 + (long)_src_1;
                      _ok((uint)((long)puVar3 - (long)end_2 == 0x7b),"%s %d",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                          ,0x5f9);
                      for (local_c8 = 0; local_c8 != 0x7b; local_c8 = local_c8 + 1) {
                        uVar1 = *end;
                        end = end + 1;
                        _ok((uint)(uVar1 == 'U'),"%s %d",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                            ,0x5fc);
                      }
                      if (end == puVar3) {
                        if (end != puStack_38) {
                          capacity._4_4_ = 0x32;
                        }
                      }
                      else {
                        capacity._4_4_ = 0x32;
                      }
                    }
                  }
                }
              }
            }
            else {
              capacity._4_4_ = 0x32;
            }
          }
          else {
            capacity._4_4_ = 0x32;
          }
        }
      }
    }
  }
LAB_0013e130:
  if (capacity._4_4_ != 0) {
    _ok(0,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x601);
  }
  ptls_buffer_dispose((ptls_buffer_t *)&src);
  return;
}

Assistant:

static void test_quicblock(void)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_buffer_push_block(&buf, -1, { ptls_buffer_pushv(&buf, "abc", 3); });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 3);
        ok(memcmp(src, "abc", 3) == 0);
        src += 3;
    });

    buf.off = 0;
    ptls_buffer_push_block(&buf, -1, {
        if ((ret = ptls_buffer_reserve(&buf, 123)) != 0)
            goto Exit;
        memset(buf.base + buf.off, 0x55, 123);
        buf.off += 123;
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 123);
        size_t i;
        for (i = 0; i != 123; ++i)
            ok(*src++ == 0x55);
    });

Exit:
    if (ret != 0)
        ok(!"fail");
    ptls_buffer_dispose(&buf);
}